

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint16_t uVar8;
  int iVar9;
  float fVar10;
  uint32_t ui;
  long lVar11;
  long in_RDI;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  uint8_t *cdata;
  int32_t tmp;
  int32_t samps;
  void *outpix;
  int x_1;
  int x;
  size_t pixstride;
  int32_t prevsamps;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  int uls;
  int ubpc;
  int bpc;
  int h;
  int w;
  void **pdata;
  int32_t *sampbuffer;
  uint8_t *srcbuffer;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  int local_10c;
  int local_fc;
  int local_ec;
  int local_dc;
  int local_cc;
  int local_bc;
  int local_ac;
  int local_9c;
  int local_8c;
  float *local_80;
  int local_74;
  int local_68;
  int local_64;
  int local_54;
  int local_44;
  int local_40;
  long *local_28;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0xa8);
  iVar2 = *(int *)(in_RDI + 0x30);
  iVar3 = *(int *)(in_RDI + 0x2c);
  iVar4 = *(int *)(in_RDI + 100);
  iVar5 = *(int *)(in_RDI + 0x60);
  local_40 = 0;
  do {
    if (iVar3 - iVar4 <= local_40) {
      return 0;
    }
    for (local_44 = 0; local_44 < *(short *)(in_RDI + 0x10); local_44 = local_44 + 1) {
      lVar11 = *(long *)(in_RDI + 8) + (long)local_44 * 0x30;
      local_54 = 0;
      iVar9 = (int)*(short *)(lVar11 + 0x1c);
      if ((local_40 < iVar5) || (*(long *)(lVar11 + 0x28) == 0)) {
        if ((*(ushort *)(in_RDI + 0x12) & 1) != 0) {
          for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
          }
        }
      }
      else {
        local_28 = (long *)(((long)local_40 - (long)iVar5) *
                            ((ulong)(long)*(int *)(lVar11 + 0x24) >> 3) * 8 +
                           *(long *)(lVar11 + 0x28));
        iVar6 = *(int *)(lVar11 + 0x20);
        for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
          local_80 = (float *)*local_28;
          iVar7 = *(int *)(local_20 + (long)local_68 * 4);
          local_74 = iVar7;
          if ((*(ushort *)(in_RDI + 0x12) & 1) == 0) {
            local_74 = iVar7 - local_54;
            local_54 = iVar7;
          }
          local_28 = (long *)(((long)iVar6 & 0xfffffffffffffff8U) + (long)local_28);
          if (local_80 != (float *)0x0) {
            sVar1 = *(short *)(lVar11 + 0x1a);
            if (sVar1 == 0) {
              in_stack_fffffffffffffee4 = (uint)*(ushort *)(lVar11 + 0x1e);
              if (in_stack_fffffffffffffee4 == 0) {
                for (local_10c = 0; local_10c < local_74; local_10c = local_10c + 1) {
                  fVar10 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                                    in_stack_fffffffffffffee0));
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else if (in_stack_fffffffffffffee4 == 1) {
                for (local_ec = 0; local_ec < local_74; local_ec = local_ec + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
                  uVar8 = uint_to_half(0x1589f8);
                  *(uint16_t *)local_80 = uVar8;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else {
                if (in_stack_fffffffffffffee4 != 2) {
                  return 3;
                }
                for (local_fc = 0; local_fc < local_74; local_fc = local_fc + 1) {
                  ui = unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                         in_stack_fffffffffffffee0));
                  fVar10 = uint_to_float(ui);
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
            }
            else if (sVar1 == 1) {
              sVar1 = *(short *)(lVar11 + 0x1e);
              if (sVar1 == 0) {
                for (local_ac = 0; local_ac < local_74; local_ac = local_ac + 1) {
                  unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
                  fVar10 = (float)half_to_uint(0x15);
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else if (sVar1 == 1) {
                for (local_8c = 0; local_8c < local_74; local_8c = local_8c + 1) {
                  uVar8 = unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                            in_stack_fffffffffffffee0));
                  *(uint16_t *)local_80 = uVar8;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else {
                if (sVar1 != 2) {
                  return 3;
                }
                for (local_9c = 0; local_9c < local_74; local_9c = local_9c + 1) {
                  unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
                  fVar10 = half_to_float(0);
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
            }
            else {
              if (sVar1 != 2) {
                return 3;
              }
              sVar1 = *(short *)(lVar11 + 0x1e);
              if (sVar1 == 0) {
                for (local_dc = 0; local_dc < local_74; local_dc = local_dc + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
                  fVar10 = (float)float_to_uint_int(0);
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else if (sVar1 == 1) {
                for (local_bc = 0; local_bc < local_74; local_bc = local_bc + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
                  uVar8 = float_to_half_int(0);
                  *(uint16_t *)local_80 = uVar8;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
              else {
                if (sVar1 != 2) {
                  return 3;
                }
                for (local_cc = 0; local_cc < local_74; local_cc = local_cc + 1) {
                  fVar10 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffee4,
                                                                    in_stack_fffffffffffffee0));
                  *local_80 = fVar10;
                  local_80 = (float *)((long)local_80 + (long)iVar9);
                }
              }
            }
          }
        }
      }
    }
    local_20 = local_20 + (long)iVar2 * 4;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc, uls;

    w   = decode->chunk.width;
    h   = decode->chunk.height - decode->user_line_end_ignore;
    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;
    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (y < uls || !pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y - uls) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = outpix;

                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += ((size_t) bpc) * ((size_t) samps);
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}